

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.h
# Opt level: O1

bool __thiscall GouraudShader::fragment(GouraudShader *this,Model *model,vec3f bar,TGAColor *color)

{
  size_t i;
  long lVar1;
  double dVar2;
  double dVar3;
  TGAColor res;
  undefined4 local_18 [2];
  byte local_10 [8];
  
  dVar2 = dot<3ul,double>(&this->varying_ity,&bar);
  local_10[0] = 0xff;
  local_10[1] = 0xff;
  local_10[2] = 0xff;
  local_10[3] = 0xff;
  local_18[0] = 0xffffffff;
  dVar3 = 1.0;
  if (dVar2 <= 1.0) {
    dVar3 = dVar2;
  }
  if (dVar3 <= 0.0) {
    dVar3 = 0.0;
  }
  lVar1 = 0;
  do {
    *(char *)((long)local_18 + lVar1) = (char)(int)((double)local_10[lVar1] * dVar3);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  color->bytespp = '\x04';
  *(undefined4 *)color->bgra = local_18[0];
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        double intensity = dot(varying_ity, bar);
        color = TGAColor(255, 255, 255) * intensity;
        return false;
    }